

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_link(void)

{
  ulong uVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  uv_loop_t **ppuVar5;
  undefined1 *unaff_R14;
  uv_buf_t uVar6;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_t req;
  long alStack_3e0 [11];
  ulong uStack_388;
  long lStack_380;
  uv_loop_t *puStack_220;
  code *pcStack_218;
  undefined8 uStack_208;
  uv_loop_t *puStack_200;
  undefined8 local_1f8;
  uv_loop_t *local_1e8;
  uv_loop_t *local_1e0;
  uv_loop_t *local_180;
  
  puVar3 = (uv_loop_t *)0x1e9f34;
  puStack_200 = (uv_loop_t *)0x192a4d;
  unlink("test_file");
  puStack_200 = (uv_loop_t *)0x192a59;
  unlink("test_file_link");
  puStack_200 = (uv_loop_t *)0x192a65;
  unlink("test_file_link2");
  puStack_200 = (uv_loop_t *)0x192a6a;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_200 = (uv_loop_t *)0x192a8e;
  iVar2 = uv_fs_open(0,&stack0xfffffffffffffe28,"test_file",0x42,0x180,0);
  puVar4 = local_180;
  local_1e0 = (uv_loop_t *)(long)iVar2;
  local_1e8 = (uv_loop_t *)0x0;
  if (local_1e0 == (uv_loop_t *)0x0) {
    local_1e0 = local_180;
    local_1e8 = (uv_loop_t *)0x0;
    puVar3 = local_180;
    if ((long)local_180 < 0) goto LAB_00192fec;
    unaff_R14 = &stack0xfffffffffffffe28;
    puStack_200 = (uv_loop_t *)0x192ade;
    uv_fs_req_cleanup(unaff_R14);
    puStack_200 = (uv_loop_t *)0x192aef;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    local_1f8 = 0;
    puStack_200 = (uv_loop_t *)0x192b25;
    iVar2 = uv_fs_write(0,unaff_R14,(ulong)puVar4 & 0xffffffff,&iov,1,0xffffffffffffffff);
    local_1e0 = (uv_loop_t *)(long)iVar2;
    local_1e8 = (uv_loop_t *)0xd;
    puVar3 = puVar4;
    if (local_1e0 != (uv_loop_t *)0xd) goto LAB_00192ffb;
    local_1e0 = local_180;
    local_1e8 = (uv_loop_t *)0xd;
    if (local_180 != (uv_loop_t *)0xd) goto LAB_0019300a;
    unaff_R14 = &stack0xfffffffffffffe28;
    puStack_200 = (uv_loop_t *)0x192b75;
    uv_fs_req_cleanup(unaff_R14);
    puStack_200 = (uv_loop_t *)0x192b83;
    iVar2 = uv_fs_close(0,unaff_R14,(ulong)puVar4 & 0xffffffff,0);
    if (iVar2 != 0) goto LAB_00193019;
    if (local_180 != (uv_loop_t *)0x0) goto LAB_0019301e;
    puVar3 = (uv_loop_t *)&stack0xfffffffffffffe28;
    puStack_200 = (uv_loop_t *)0x192ba4;
    uv_fs_req_cleanup(puVar3);
    puStack_200 = (uv_loop_t *)0x192bbf;
    iVar2 = uv_fs_link(0,puVar3,"test_file","test_file_link",0);
    local_1e0 = (uv_loop_t *)(long)iVar2;
    local_1e8 = (uv_loop_t *)0x0;
    if (local_1e0 != (uv_loop_t *)0x0) goto LAB_00193023;
    local_1e0 = local_180;
    local_1e8 = (uv_loop_t *)0x0;
    if (local_180 != (uv_loop_t *)0x0) goto LAB_00193032;
    puStack_200 = (uv_loop_t *)0x192c0f;
    uv_fs_req_cleanup((uv_loop_t *)&stack0xfffffffffffffe28);
    puStack_200 = (uv_loop_t *)0x192c2b;
    iVar2 = uv_fs_open(0,(uv_loop_t *)&stack0xfffffffffffffe28,"test_file_link",2,0,0);
    puVar4 = local_180;
    local_1e0 = (uv_loop_t *)(long)iVar2;
    local_1e8 = (uv_loop_t *)0x0;
    puVar3 = (uv_loop_t *)&stack0xfffffffffffffe28;
    if (local_1e0 != (uv_loop_t *)0x0) goto LAB_00193041;
    local_1e0 = local_180;
    local_1e8 = (uv_loop_t *)0x0;
    if ((long)local_180 < 0) goto LAB_00193050;
    unaff_R14 = &stack0xfffffffffffffe28;
    puStack_200 = (uv_loop_t *)0x192c7b;
    uv_fs_req_cleanup(unaff_R14);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_200 = (uv_loop_t *)0x192c9d;
    uVar6 = (uv_buf_t)uv_buf_init(buf,0x20);
    local_1f8 = 0;
    puStack_200 = (uv_loop_t *)0x192cce;
    iov = uVar6;
    iVar2 = uv_fs_read(0,unaff_R14,(ulong)puVar4 & 0xffffffff,&iov,1,0);
    local_1e0 = (uv_loop_t *)(long)iVar2;
    local_1e8 = (uv_loop_t *)0x0;
    if ((long)local_1e0 < 0) goto LAB_0019305f;
    local_1e0 = local_180;
    local_1e8 = (uv_loop_t *)0x0;
    if ((long)local_180 < 0) goto LAB_0019306e;
    puStack_200 = (uv_loop_t *)0x192d20;
    iVar2 = strcmp(buf,test_buf);
    local_1e0 = (uv_loop_t *)(long)iVar2;
    local_1e8 = (uv_loop_t *)0x0;
    if (local_1e0 != (uv_loop_t *)0x0) goto LAB_0019307d;
    puStack_200 = (uv_loop_t *)0x192d50;
    iVar2 = uv_fs_close(0,&stack0xfffffffffffffe28,(ulong)puVar4 & 0xffffffff,0);
    if (iVar2 != 0) goto LAB_0019308c;
    if (local_180 != (uv_loop_t *)0x0) goto LAB_00193091;
    puVar4 = (uv_loop_t *)&stack0xfffffffffffffe28;
    puStack_200 = (uv_loop_t *)0x192d71;
    uv_fs_req_cleanup(puVar4);
    puStack_200 = (uv_loop_t *)0x192d95;
    iVar2 = uv_fs_link(loop,puVar4,"test_file","test_file_link2",link_cb);
    local_1e0 = (uv_loop_t *)(long)iVar2;
    local_1e8 = (uv_loop_t *)0x0;
    if (local_1e0 != (uv_loop_t *)0x0) goto LAB_00193096;
    puStack_200 = (uv_loop_t *)0x192dc3;
    uv_run(loop,0);
    local_1e0 = (uv_loop_t *)0x1;
    local_1e8 = (uv_loop_t *)(long)link_cb_count;
    if (local_1e8 != (uv_loop_t *)0x1) goto LAB_001930a5;
    puStack_200 = (uv_loop_t *)0x192e06;
    iVar2 = uv_fs_open(0,&stack0xfffffffffffffe28,"test_file_link2",2,0,0);
    puVar3 = local_180;
    local_1e0 = (uv_loop_t *)(long)iVar2;
    local_1e8 = (uv_loop_t *)0x0;
    if (local_1e0 != (uv_loop_t *)0x0) goto LAB_001930b4;
    local_1e0 = local_180;
    local_1e8 = (uv_loop_t *)0x0;
    if ((long)local_180 < 0) goto LAB_001930c3;
    unaff_R14 = &stack0xfffffffffffffe28;
    puStack_200 = (uv_loop_t *)0x192e56;
    uv_fs_req_cleanup(unaff_R14);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_200 = (uv_loop_t *)0x192e78;
    uVar6 = (uv_buf_t)uv_buf_init(buf,0x20);
    local_1f8 = 0;
    puStack_200 = (uv_loop_t *)0x192ea9;
    iov = uVar6;
    iVar2 = uv_fs_read(0,unaff_R14,(ulong)puVar3 & 0xffffffff,&iov,1,0);
    local_1e0 = (uv_loop_t *)(long)iVar2;
    local_1e8 = (uv_loop_t *)0x0;
    if ((long)local_1e0 < 0) goto LAB_001930d2;
    local_1e0 = local_180;
    local_1e8 = (uv_loop_t *)0x0;
    if ((long)local_180 < 0) goto LAB_001930e1;
    puStack_200 = (uv_loop_t *)0x192efb;
    iVar2 = strcmp(buf,test_buf);
    local_1e0 = (uv_loop_t *)(long)iVar2;
    local_1e8 = (uv_loop_t *)0x0;
    if (local_1e0 != (uv_loop_t *)0x0) goto LAB_001930f0;
    puStack_200 = (uv_loop_t *)0x192f2b;
    iVar2 = uv_fs_close(0,&stack0xfffffffffffffe28,(ulong)puVar3 & 0xffffffff,0);
    if (iVar2 != 0) goto LAB_001930ff;
    if (local_180 != (uv_loop_t *)0x0) goto LAB_00193104;
    puStack_200 = (uv_loop_t *)0x192f49;
    uv_fs_req_cleanup(&stack0xfffffffffffffe28);
    puStack_200 = (uv_loop_t *)0x192f57;
    uv_run(loop,0);
    puStack_200 = (uv_loop_t *)0x192f63;
    unlink("test_file");
    puStack_200 = (uv_loop_t *)0x192f6f;
    unlink("test_file_link");
    puStack_200 = (uv_loop_t *)0x192f7b;
    unlink("test_file_link2");
    puVar3 = loop;
    puStack_200 = (uv_loop_t *)0x192f93;
    uv_walk(loop,close_walk_cb,0);
    puStack_200 = (uv_loop_t *)0x192f9d;
    uv_run(puVar3,0);
    local_1e0 = (uv_loop_t *)0x0;
    puStack_200 = (uv_loop_t *)0x192fb2;
    iVar2 = uv_loop_close(loop);
    local_1e8 = (uv_loop_t *)(long)iVar2;
    if (local_1e0 == local_1e8) {
      puStack_200 = (uv_loop_t *)0x192fce;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_200 = (uv_loop_t *)0x192fec;
    run_test_fs_link_cold_1();
LAB_00192fec:
    puStack_200 = (uv_loop_t *)0x192ffb;
    run_test_fs_link_cold_25();
LAB_00192ffb:
    puStack_200 = (uv_loop_t *)0x19300a;
    run_test_fs_link_cold_2();
LAB_0019300a:
    puStack_200 = (uv_loop_t *)0x193019;
    run_test_fs_link_cold_3();
LAB_00193019:
    puStack_200 = (uv_loop_t *)0x19301e;
    run_test_fs_link_cold_4();
LAB_0019301e:
    puStack_200 = (uv_loop_t *)0x193023;
    run_test_fs_link_cold_5();
LAB_00193023:
    puStack_200 = (uv_loop_t *)0x193032;
    run_test_fs_link_cold_6();
LAB_00193032:
    puStack_200 = (uv_loop_t *)0x193041;
    run_test_fs_link_cold_7();
LAB_00193041:
    puVar4 = puVar3;
    puStack_200 = (uv_loop_t *)0x193050;
    run_test_fs_link_cold_8();
LAB_00193050:
    puStack_200 = (uv_loop_t *)0x19305f;
    run_test_fs_link_cold_24();
LAB_0019305f:
    puStack_200 = (uv_loop_t *)0x19306e;
    run_test_fs_link_cold_23();
LAB_0019306e:
    puStack_200 = (uv_loop_t *)0x19307d;
    run_test_fs_link_cold_22();
LAB_0019307d:
    puStack_200 = (uv_loop_t *)0x19308c;
    run_test_fs_link_cold_9();
LAB_0019308c:
    puStack_200 = (uv_loop_t *)0x193091;
    run_test_fs_link_cold_10();
LAB_00193091:
    puStack_200 = (uv_loop_t *)0x193096;
    run_test_fs_link_cold_11();
LAB_00193096:
    puStack_200 = (uv_loop_t *)0x1930a5;
    run_test_fs_link_cold_12();
LAB_001930a5:
    puStack_200 = (uv_loop_t *)0x1930b4;
    run_test_fs_link_cold_13();
LAB_001930b4:
    puVar3 = puVar4;
    puStack_200 = (uv_loop_t *)0x1930c3;
    run_test_fs_link_cold_14();
LAB_001930c3:
    puStack_200 = (uv_loop_t *)0x1930d2;
    run_test_fs_link_cold_21();
LAB_001930d2:
    puStack_200 = (uv_loop_t *)0x1930e1;
    run_test_fs_link_cold_20();
LAB_001930e1:
    puStack_200 = (uv_loop_t *)0x1930f0;
    run_test_fs_link_cold_19();
LAB_001930f0:
    puStack_200 = (uv_loop_t *)0x1930ff;
    run_test_fs_link_cold_15();
LAB_001930ff:
    puStack_200 = (uv_loop_t *)0x193104;
    run_test_fs_link_cold_16();
LAB_00193104:
    puStack_200 = (uv_loop_t *)0x193109;
    run_test_fs_link_cold_17();
  }
  ppuVar5 = &local_1e0;
  puStack_200 = (uv_loop_t *)link_cb;
  run_test_fs_link_cold_18();
  puStack_200 = (uv_loop_t *)(long)*(int *)(ppuVar5 + 9);
  uStack_208 = 0x17;
  if (puStack_200 == (uv_loop_t *)0x17) {
    puStack_200 = ppuVar5[0xb];
    uStack_208 = 0;
    if (puStack_200 == (uv_loop_t *)0x0) {
      link_cb_count = link_cb_count + 1;
      iVar2 = uv_fs_req_cleanup();
      return iVar2;
    }
  }
  else {
    pcStack_218 = (code *)0x193176;
    link_cb_cold_1();
  }
  pcStack_218 = run_test_fs_readlink;
  link_cb_cold_2();
  puStack_220 = puVar3;
  pcStack_218 = (code *)unaff_R14;
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = uv_fs_readlink(loop,alStack_3e0,"no_such_file",dummy_cb);
  if (iVar2 == 0) {
    iVar2 = uv_run(loop,0);
    if (iVar2 != 0) goto LAB_0019345b;
    if (dummy_cb_count != 1) goto LAB_0019346a;
    if (lStack_380 != 0) goto LAB_00193479;
    if (uStack_388 != 0xfffffffffffffffe) goto LAB_0019347e;
    uv_fs_req_cleanup(alStack_3e0);
    iVar2 = uv_fs_readlink(0,alStack_3e0,"no_such_file",0);
    if (iVar2 != -2) goto LAB_0019348d;
    if (lStack_380 != 0) goto LAB_0019349c;
    if (uStack_388 != 0xfffffffffffffffe) goto LAB_001934a1;
    uv_fs_req_cleanup(alStack_3e0);
    iVar2 = uv_fs_open(0,alStack_3e0,"test_file",0x42,0x180,0);
    uVar1 = uStack_388;
    if (iVar2 != 0) goto LAB_001934b0;
    if ((long)uStack_388 < 0) goto LAB_001934bf;
    uv_fs_req_cleanup(alStack_3e0);
    iVar2 = uv_fs_close(0,alStack_3e0,uVar1 & 0xffffffff,0);
    if (iVar2 != 0) goto LAB_001934ce;
    if (uStack_388 != 0) goto LAB_001934dd;
    uv_fs_req_cleanup(alStack_3e0);
    iVar2 = uv_fs_readlink(0,alStack_3e0,"test_file",0);
    if (iVar2 == -0x16) {
      uv_fs_req_cleanup(alStack_3e0);
      unlink("test_file");
      puVar3 = loop;
      uv_walk(loop,close_walk_cb,0);
      uv_run(puVar3,0);
      alStack_3e0[0] = 0;
      iVar2 = uv_loop_close(loop);
      if (alStack_3e0[0] == iVar2) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001934fb;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_0019345b:
    run_test_fs_readlink_cold_2();
LAB_0019346a:
    run_test_fs_readlink_cold_3();
LAB_00193479:
    run_test_fs_readlink_cold_4();
LAB_0019347e:
    run_test_fs_readlink_cold_5();
LAB_0019348d:
    run_test_fs_readlink_cold_6();
LAB_0019349c:
    run_test_fs_readlink_cold_7();
LAB_001934a1:
    run_test_fs_readlink_cold_8();
LAB_001934b0:
    run_test_fs_readlink_cold_9();
LAB_001934bf:
    run_test_fs_readlink_cold_14();
LAB_001934ce:
    run_test_fs_readlink_cold_10();
LAB_001934dd:
    run_test_fs_readlink_cold_11();
  }
  run_test_fs_readlink_cold_12();
LAB_001934fb:
  run_test_fs_readlink_cold_13();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_link) {
  int r;
  uv_fs_t req;
  uv_os_fd_t file;
  uv_os_fd_t link;

  /* Setup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", UV_FS_O_RDWR | UV_FS_O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT_OK(r);
  ASSERT_GE(req.result, 0);
  file = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT_EQ(r, sizeof(test_buf));
  ASSERT_EQ(req.result, sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  /* Close file */
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* sync link */
  r = uv_fs_link(NULL, &req, "test_file", "test_file_link", NULL);
  ASSERT_OK(r);
  ASSERT_OK(req.result);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(NULL, &req, "test_file_link", UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  ASSERT_GE(req.result, 0);
  link = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT_GE(r, 0);
  ASSERT_GE(req.result, 0);
  ASSERT_OK(strcmp(buf, test_buf));

  /* Close link */
  r = uv_fs_close(NULL, &req, link, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* async link */
  r = uv_fs_link(loop, &req, "test_file", "test_file_link2", link_cb);
  ASSERT_OK(r);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(1, link_cb_count);

  r = uv_fs_open(NULL, &req, "test_file_link2", UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  ASSERT_GE(req.result, 0);
  link = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT_GE(r, 0);
  ASSERT_GE(req.result, 0);
  ASSERT_OK(strcmp(buf, test_buf));

  /* Close link */
  r = uv_fs_close(NULL, &req, link, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}